

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

int64_t absl::lts_20250127::IDivDuration(Duration num,Duration den,Duration *rem)

{
  Duration den_00;
  Duration num_00;
  bool bVar1;
  Duration *rem_local;
  Duration den_local;
  Duration num_local;
  int64_t local_60;
  int64_t q;
  byte local_49;
  HiRep local_48;
  uint32_t local_40;
  HiRep local_38;
  uint32_t local_30;
  HiRep local_2c;
  uint32_t local_24;
  HiRep local_1c;
  uint32_t local_14;
  int64_t local_10;
  
  local_24 = num.rep_lo_;
  local_2c = num.rep_hi_;
  local_40 = den.rep_lo_;
  local_48 = den.rep_hi_;
  local_49 = 1;
  local_60 = 0;
  q = (int64_t)rem;
  local_38 = local_48;
  local_30 = local_40;
  local_1c = local_2c;
  local_14 = local_24;
  bVar1 = anon_unknown_1::IDivFastPath(num,den,&local_60,rem);
  if (bVar1) {
    local_10 = local_60;
  }
  else {
    num_00.rep_lo_ = local_14;
    num_00.rep_hi_ = local_1c;
    den_00.rep_lo_ = local_30;
    den_00.rep_hi_ = local_38;
    local_10 = anon_unknown_1::IDivSlowPath((bool)(local_49 & 1),num_00,den_00,(Duration *)q);
  }
  return local_10;
}

Assistant:

int64_t IDivDuration(Duration num, Duration den, Duration* rem) {
  return IDivDurationImpl(true, num, den,
                          rem);  // trunc towards zero
}